

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl-ncurses.cpp
# Opt level: O2

void updateRequests_impl(void)

{
  undefined8 uVar1;
  CURLM *pCVar2;
  int *piVar3;
  size_type sVar4;
  long lVar5;
  CURL *pCVar6;
  array<Data,_5UL> *paVar7;
  int still_alive;
  int msgs_left;
  Data *data;
  
  msgs_left = -1;
  while (piVar3 = (int *)curl_multi_info_read(g_cm,&msgs_left), piVar3 != (int *)0x0) {
    if (*piVar3 == 1) {
      uVar1 = *(undefined8 *)(piVar3 + 2);
      curl_easy_getinfo(uVar1,0x100015,&data);
      data->running = false;
      curl_multi_remove_handle(g_cm,uVar1);
    }
    else {
      fprintf(_stderr,"E: CURLMsg (%d)\n");
    }
  }
  still_alive = 1;
  curl_multi_perform(g_cm,&still_alive);
  if (still_alive < 5) {
    while (sVar4 = std::
                   deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&g_fetchQueue_abi_cxx11_), sVar4 != 0) {
      paVar7 = &g_fetchData;
      lVar5 = 5;
      while (paVar7->_M_elems[0].running == true) {
        paVar7 = (array<Data,_5UL> *)((long)paVar7 + 0x50);
        lVar5 = lVar5 + -1;
        if (lVar5 == 0) {
          return;
        }
      }
      if (lVar5 == 0) {
        return;
      }
      std::__cxx11::string::string
                ((string *)&data,
                 (string *)
                 g_fetchQueue_abi_cxx11_.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&g_fetchQueue_abi_cxx11_);
      g_nFetches = g_nFetches + 1;
      paVar7->_M_elems[0].running = true;
      std::__cxx11::string::_M_assign((string *)&paVar7->_M_elems[0].uri);
      pCVar2 = g_cm;
      pCVar6 = paVar7->_M_elems[0].eh;
      if (pCVar6 == (CURL *)0x0) {
        pCVar6 = (CURL *)curl_easy_init();
        paVar7->_M_elems[0].eh = pCVar6;
      }
      curl_easy_setopt(pCVar6,0x2712,data);
      curl_easy_setopt(pCVar6,0x2777,paVar7);
      curl_easy_setopt(pCVar6,0x4e2b,writeFunction);
      curl_easy_setopt(pCVar6,0x2711,paVar7);
      curl_multi_add_handle(pCVar2,pCVar6);
      still_alive = still_alive + 1;
      std::__cxx11::string::~string((string *)&data);
      if (4 < still_alive) {
        return;
      }
    }
  }
  return;
}

Assistant:

void updateRequests_impl() {
    CURLMsg *msg;
    int msgs_left = -1;

    while ((msg = curl_multi_info_read(g_cm, &msgs_left))) {
        if (msg->msg == CURLMSG_DONE) {
            Data* data;
            CURL *e = msg->easy_handle;
            curl_easy_getinfo(msg->easy_handle, CURLINFO_PRIVATE, &data);
            data->running = false;
            curl_multi_remove_handle(g_cm, e);
            //curl_easy_cleanup(e);
            //data->eh = NULL;
        } else {
            fprintf(stderr, "E: CURLMsg (%d)\n", msg->msg);
        }
    }

    int still_alive = 1;

    curl_multi_perform(g_cm, &still_alive);

    while (still_alive < MAX_PARALLEL && g_fetchQueue.size() > 0) {
        int idx = 0;
        while (g_fetchData[idx].running) {
            ++idx;
            if (idx == g_fetchData.size()) break;
        }
        if (idx == g_fetchData.size()) break;

        auto uri = std::move(g_fetchQueue.front());
        g_fetchQueue.pop_front();

#ifdef ENABLE_API_CACHE
        auto fname = ::getCacheFname(uri);

        std::ifstream fin(fname);
        if (fin.is_open() && fin.good()) {
            std::string str((std::istreambuf_iterator<char>(fin)), std::istreambuf_iterator<char>());
            fin.close();

            g_fetchCache[uri] = std::move(str);

            continue;
        }
#endif

        ++g_nFetches;

        g_fetchData[idx].running = true;
        g_fetchData[idx].uri = uri;
        addTransfer(g_cm, idx, std::move(uri));

        ++still_alive;
    }
}